

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uscript_props.cpp
# Opt level: O0

int32_t uscript_getSampleString_63
                  (UScriptCode script,UChar *dest,int32_t capacity,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint uVar2;
  int32_t local_30;
  int32_t i;
  int32_t length;
  int32_t sampleChar;
  UErrorCode *pErrorCode_local;
  int32_t capacity_local;
  UChar *dest_local;
  UScriptCode script_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if ((capacity < 0) || ((0 < capacity && (dest == (UChar *)0x0)))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      dest_local._4_4_ = 0;
    }
    else {
      uVar2 = anon_unknown.dwarf_feba7::getScriptProps(script);
      uVar2 = uVar2 & 0x1fffff;
      if (uVar2 == 0) {
        local_30 = 0;
      }
      else {
        local_30 = 2;
        if (uVar2 < 0x10000) {
          local_30 = 1;
        }
        if (local_30 <= capacity) {
          if (uVar2 < 0x10000) {
            *dest = (UChar)uVar2;
          }
          else {
            *dest = (short)((int)uVar2 >> 10) + L'ퟀ';
            dest[1] = (UChar)uVar2 & 0x3ffU | 0xdc00;
          }
        }
      }
      dest_local._4_4_ = u_terminateUChars_63(dest,capacity,local_30,pErrorCode);
    }
  }
  else {
    dest_local._4_4_ = 0;
  }
  return dest_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uscript_getSampleString(UScriptCode script, UChar *dest, int32_t capacity, UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) { return 0; }
    if(capacity < 0 || (capacity > 0 && dest == NULL)) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t sampleChar = getScriptProps(script) & 0x1fffff;
    int32_t length;
    if(sampleChar == 0) {
        length = 0;
    } else {
        length = U16_LENGTH(sampleChar);
        if(length <= capacity) {
            int32_t i = 0;
            U16_APPEND_UNSAFE(dest, i, sampleChar);
        }
    }
    return u_terminateUChars(dest, capacity, length, pErrorCode);
}